

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_qwen2moe::llm_build_qwen2moe
          (llm_build_qwen2moe *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *k_cur;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ggml_backend_buffer *name;
  int extraout_var;
  ggml_tensor *pgVar8;
  int64_t iVar9;
  ggml_tensor *up_s;
  ggml_tensor *pgVar10;
  pointer plVar11;
  ggml_tensor *pgVar12;
  undefined8 in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_shexp_out;
  ggml_tensor *cur_ffn;
  ggml_tensor *cur_gate;
  ggml_tensor *cur_gate_inp;
  ggml_tensor *moe_out;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd18;
  int iVar13;
  llm_graph_context *in_stack_fffffffffffffd20;
  ggml_backend_buffer *pgVar14;
  ggml_tensor *in_stack_fffffffffffffd28;
  ggml_tensor *pgVar15;
  ggml_tensor *in_stack_fffffffffffffd30;
  ggml_tensor *pgVar16;
  llm_graph_context *this_00;
  ggml_tensor *in_stack_fffffffffffffd38;
  undefined4 uVar18;
  ggml_tensor *pgVar17;
  llm_graph_context *in_stack_fffffffffffffd40;
  ggml_tensor *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd78;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *pgVar19;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffe10;
  int64_t iVar20;
  ggml_tensor *n_expert_used;
  llm_ffn_op_type lVar21;
  ggml_tensor *in_stack_fffffffffffffe28;
  llm_graph_context *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffee0;
  ggml_tensor *in_stack_fffffffffffffef0;
  ggml_tensor *in_stack_fffffffffffffef8;
  ggml_tensor *in_stack_ffffffffffffff00;
  int iVar22;
  ggml_tensor *in_stack_ffffffffffffff40;
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  ggml_tensor *local_78;
  ggml_tensor *local_70;
  int local_64;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd30,
             (llm_graph_params *)in_stack_fffffffffffffd28);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x19bb,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x19bc,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  local_50 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pgVar10 = local_50;
  pgVar3 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffd80);
  pgVar12 = pgVar3;
  k_cur = (ggml_tensor *)
          llm_graph_context::build_attn_inp_kv_unified
                    ((llm_graph_context *)in_stack_fffffffffffffdc0);
  for (local_64 = 0; iVar22 = (int)in_stack_ffffffffffffff40,
      iVar13 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20), (long)local_64 < in_RDI->ne[3];
      local_64 = local_64 + 1) {
    local_70 = local_50;
    pgVar19 = local_50;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    llm_graph_context::build_norm
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28,(llm_norm_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
               (int)in_stack_fffffffffffffd20);
    uVar18 = (undefined4)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                        in_stack_fffffffffffffd70);
    pgVar8 = pgVar4;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    local_78 = pgVar4;
    if (pvVar5->bq != (ggml_tensor *)0x0) {
      in_stack_fffffffffffffef0 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      local_78 = (ggml_tensor *)ggml_add(in_stack_fffffffffffffef0,pgVar4,pvVar5->bq);
      in_stack_ffffffffffffff00 = local_78;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (char *)in_stack_fffffffffffffd20,iVar13);
      in_stack_fffffffffffffef8 = pgVar4;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    local_80 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                          in_stack_fffffffffffffd70);
    pgVar4 = local_80;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    if (pvVar5->bk != (ggml_tensor *)0x0) {
      pgVar15 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      local_80 = (ggml_tensor *)ggml_add(pgVar15,local_80,pvVar5->bk);
      in_stack_fffffffffffffee0 = local_80;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (char *)in_stack_fffffffffffffd20,iVar13);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    local_88 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                          in_stack_fffffffffffffd70);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    if (pvVar5->bv != (ggml_tensor *)0x0) {
      pgVar15 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      local_88 = (ggml_tensor *)ggml_add(pgVar15,local_88,pvVar5->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (char *)in_stack_fffffffffffffd20,iVar13);
    }
    uVar6 = ggml_reshape_3d(in_RDI->src[5],local_78,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar7._0_4_ = in_RDI->op;
    uVar7._4_4_ = in_RDI->op_params[0];
    uVar7 = ggml_reshape_3d(in_RDI->src[5],local_80,uVar1,uVar7,(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    name = (ggml_backend_buffer *)
           ggml_reshape_3d(in_RDI->src[5],local_88,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar6,pgVar3,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar7,pgVar3,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    sqrtf((float)uVar1);
    pgVar17 = (ggml_tensor *)CONCAT44(uVar18,local_64);
    pgVar16 = (ggml_tensor *)0x0;
    pgVar15 = (ggml_tensor *)0x0;
    pgVar14 = name;
    iVar13 = extraout_var;
    local_48 = llm_graph_context::build_attn
                         ((llm_graph_context *)pgVar19,(llm_graph_input_attn_kv_unified *)pgVar8,
                          (ggml_cgraph *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef0,pgVar4,k_cur,pgVar12,pgVar10,in_RDI,
                          (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),iVar22);
    iVar22 = (int)pgVar14;
    if ((long)local_64 == in_RDI->ne[3] + -1) {
      pgVar8 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd70);
      in_stack_fffffffffffffe40 = pgVar8;
      local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,pgVar8);
      local_70 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,pgVar8);
    }
    iVar9 = ggml_add(in_RDI->src[5],local_48,local_70);
    iVar20 = iVar9;
    llm_graph_context::cb((llm_graph_context *)pgVar16,pgVar15,(char *)name,iVar13);
    lVar21 = (llm_ffn_op_type)iVar20;
    iVar20 = iVar9;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    up_s = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd40,pgVar17,pgVar16,pgVar15,
                      (llm_norm_type)((ulong)name >> 0x20),(int)name);
    n_expert_used = up_s;
    llm_graph_context::cb((llm_graph_context *)pgVar16,pgVar15,(char *)name,iVar13);
    pgVar17 = up_s;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar8 = pvVar5->ffn_gate_inp;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar19 = pvVar5->ffn_up_exps;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar4 = pvVar5->ffn_gate_exps;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar14 = *(ggml_backend_buffer **)(in_RDI->op_params + 9);
    pgVar15 = *(ggml_tensor **)(in_RDI->op_params + 0xb);
    this_00 = (llm_graph_context *)((ulong)pgVar16 & 0xffffffff00000000);
    iVar13 = 0;
    type_gate = (llm_ffn_gate_type)&stack0xfffffffffffffd18;
    pgVar16 = llm_graph_context::build_moe_ffn
                        ((llm_graph_context *)pgVar4,pgVar19,pgVar8,pgVar17,
                         in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffe10,iVar20,(int64_t)n_expert_used,lVar21,
                         SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0),
                         SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x30,0),
                         SUB84(in_stack_fffffffffffffdd0,0),
                         (llama_expert_gating_func_type)in_stack_fffffffffffffe40,iVar22);
    lVar21 = (llm_ffn_op_type)pgVar4;
    in_stack_fffffffffffffe10 = pgVar16;
    llm_graph_context::cb(this_00,pgVar15,(char *)pgVar14,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_64
              );
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                        in_stack_fffffffffffffd70);
    in_stack_fffffffffffffde0 = pgVar4;
    llm_graph_context::cb(this_00,pgVar15,(char *)pgVar14,iVar13);
    in_stack_fffffffffffffdd0 = in_RDI->src[5];
    in_stack_fffffffffffffdd8 = (ggml_tensor *)ggml_silu(in_stack_fffffffffffffdd0,pgVar4);
    uVar7 = ggml_div(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,pgVar4);
    llm_graph_context::cb(this_00,pgVar15,(char *)pgVar14,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar4 = pvVar5->ffn_up_shexp;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    pgVar15 = pvVar5->ffn_gate_shexp;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_64);
    in_stack_fffffffffffffd28 = pvVar5->ffn_down_shexp;
    in_stack_fffffffffffffd40 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd38 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd30 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd20 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd18 = (ggml_tensor *)0x0;
    pgVar8 = llm_graph_context::build_ffn
                       ((llm_graph_context *)in_stack_fffffffffffffdc0,
                        (ggml_tensor *)&stack0xfffffffffffffd18,pgVar15,pgVar4,up_s,
                        in_stack_fffffffffffffd98,in_stack_fffffffffffffdd0,
                        in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,pgVar17,pgVar8,pgVar19,
                        lVar21,type_gate,(int)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffdc0 = pgVar8;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    in_stack_fffffffffffffd98 = (ggml_tensor *)ggml_mul(in_RDI->src[5],pgVar8,uVar7);
    in_stack_ffffffffffffff40 = in_stack_fffffffffffffd98;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    uVar7 = ggml_add(in_RDI->src[5],pgVar16,in_stack_ffffffffffffff40);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    ggml_add(in_RDI->src[5],uVar7,iVar9);
    local_50 = llm_graph_context::build_cvec(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0);
    in_stack_fffffffffffffd80 = local_50;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
  }
  pgVar10 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30
                       ,in_stack_fffffffffffffd28,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                       (int)in_stack_fffffffffffffd20);
  pgVar12 = pgVar10;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (char *)in_stack_fffffffffffffd20,iVar13);
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4cf56d);
  plVar11->t_embd = pgVar10;
  pgVar12 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffd80,pgVar12,
                       in_stack_fffffffffffffd70);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (char *)in_stack_fffffffffffffd20,iVar13);
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4cf5f2);
  plVar11->t_logits = pgVar12;
  ggml_build_forward_expand(in_RCX,pgVar12);
  return;
}

Assistant:

llm_build_qwen2moe(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // MoE branch
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            ggml_tensor * moe_out =
                build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, false,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
            cb(moe_out, "ffn_moe_out", il);

            // FFN shared expert
            {
                ggml_tensor * cur_gate_inp = build_lora_mm(model.layers[il].ffn_gate_inp_shexp, cur);
                cb(cur_gate_inp, "ffn_shexp_gate_inp", il);

                // sigmoid
                ggml_tensor * cur_gate = ggml_div(ctx0, ggml_silu(ctx0, cur_gate_inp), cur_gate_inp);
                cb(cur_gate, "ffn_shexp_gate", il);

                ggml_tensor * cur_ffn = build_ffn(cur,
                        model.layers[il].ffn_up_shexp,   NULL, NULL,
                        model.layers[il].ffn_gate_shexp, NULL, NULL,
                        model.layers[il].ffn_down_shexp, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur_ffn, "ffn_shexp", il);

                ggml_tensor * ffn_shexp_out = ggml_mul(ctx0, cur_ffn, cur_gate);
                cb(ffn_shexp_out, "ffn_shexp_out", il);

                moe_out = ggml_add(ctx0, moe_out, ffn_shexp_out);
                cb(moe_out, "ffn_out", il);

                cur = moe_out;
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }